

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O3

ufile_error ufile_multiple_upload_finish(ufile_mutipart_state *self)

{
  CURL *curl;
  uint uVar1;
  list_node *node;
  curls_list *pcVar2;
  char *pcVar3;
  ufile_error uVar4;
  http_options opt;
  http_body body;
  char query [64];
  http_options local_b0;
  undefined8 local_98;
  char *pcStack_90;
  size_t local_88;
  undefined8 uStack_80;
  char local_78 [72];
  
  node = get_curl_handle(self->curls);
  if (node == (list_node *)0x0) {
    pcVar3 = "Other upload_part have not finish yet, please check your code calling order.";
    uVar1 = 0xfffffffb;
  }
  else {
    curl = node->curl;
    curl_easy_reset(curl);
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x3d] = '\0';
    local_78[0x3e] = '\0';
    local_78[0x3f] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    sprintf(local_78,"uploadId=%s",self->upload_id);
    uVar4 = set_http_options(&local_b0,"POST",self->mime_type,self->bucket_name,self->key,local_78);
    pcVar3 = uVar4.message;
    uVar1 = uVar4.code;
    if (uVar1 == 0 || uVar1 - 200 < 100) {
      uStack_80 = 0;
      local_98 = 0;
      pcStack_90 = self->etags->etag_buf;
      local_88 = self->etags->pos;
      set_content_length(&local_b0,local_88);
      curl_easy_setopt(curl,0x4e2c,http_read_cb);
      curl_easy_setopt(curl,0x2e,1);
      curl_easy_setopt(curl,0x2719,&local_98);
      curl_easy_setopt(curl,0x75a3,local_88);
      local_b0.header = (curl_slist *)curl_slist_append(local_b0.header,"Expect: ");
      set_curl_options(curl,&local_b0);
      uVar4 = curl_do(curl);
      pcVar3 = uVar4.message;
      uVar1 = uVar4.code;
      http_cleanup((CURL *)0x0,&local_b0);
    }
  }
  pcVar2 = save_curl_handle(self->curls,node);
  self->curls = pcVar2;
  free_state(self);
  uVar4._4_4_ = 0;
  uVar4.code = uVar1;
  uVar4.message = pcVar3;
  return uVar4;
}

Assistant:

struct ufile_error
ufile_multiple_upload_finish(struct ufile_mutipart_state *self){
    struct ufile_error error=NO_ERROR;
    struct list_node *node = get_curl_handle(self->curls);
    if(node == NULL){
        error.code = UFILE_MULTIPLE_NOT_FINISH_ERROR_CODE;
        error.message = "Other upload_part have not finish yet, please check your code calling order.";
        goto FAILED;
    }
    CURL *curl = node->curl;
    curl_easy_reset(curl);

    struct http_options opt;
    char query[64]={0};
    sprintf(query, "uploadId=%s",self->upload_id);
    error = set_http_options(&opt, "POST", self->mime_type, self->bucket_name, self->key, query);
    if(UFILE_HAS_ERROR(error.code)){
        //set_http_options 在错误时不会分配内存，所以不需要释放。
        goto FAILED;
    }

    struct http_body body;
    memset(&body, 0, sizeof(struct http_body));
    struct etag_slist *list = self->etags;
    body.buffer = list->etag_buf;
    body.buffer_size = list->pos;
    set_content_length(&opt, body.buffer_size);
    curl_easy_setopt(curl, CURLOPT_READFUNCTION, http_read_cb);
    curl_easy_setopt(curl, CURLOPT_UPLOAD, 1L);
    curl_easy_setopt(curl, CURLOPT_READDATA, &body);
    curl_easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)body.buffer_size);
    opt.header = curl_slist_append(opt.header, "Expect: ");

    set_curl_options(curl, &opt);

    error = curl_do(curl);
    http_cleanup(NULL, &opt);
FAILED:
    self->curls = save_curl_handle(self->curls, node); //把 curl 还回去，由 free_state 统一释放资源
    free_state(self);
    return error;
}